

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::convertFromXYZFloat
               (float *out,float *in,uint w,uint h,LodePNGState *state,float *whitepoint,
               uint rendering_intent)

{
  uint uVar1;
  uint uVar2;
  uint use_icc;
  LodePNGICC icc;
  
  icc.trc[0].lut = (float *)0x0;
  icc.trc[0].lut_size = 0;
  icc.trc[1].lut = (float *)0x0;
  icc.trc[1].lut_size = 0;
  icc.trc[2].lut = (float *)0x0;
  icc.trc[2].lut_size = 0;
  use_icc = 0;
  if ((state->info_png).iccp_defined != 0) {
    uVar1 = parseICC(&icc,(state->info_png).iccp_profile,(ulong)(state->info_png).iccp_profile_size)
    ;
    uVar2 = 1;
    if (uVar1 != 0) goto LAB_0011de7b;
    if (icc.inputspace == 0) {
      use_icc = 0;
    }
    else if (((icc.inputspace != 2) || (icc.has_chromaticity != 0)) && (icc.has_whitepoint != 0)) {
      use_icc = (uint)(icc.has_trc != 0);
    }
  }
  uVar2 = convertFromXYZ_chrm(out,in,w,h,&state->info_png,use_icc,&icc,whitepoint,rendering_intent);
  if (uVar2 == 0) {
    convertFromXYZ_gamma(out,w,h,&state->info_png,use_icc,&icc);
    uVar2 = 0;
  }
LAB_0011de7b:
  free(icc.trc[0].lut);
  free(icc.trc[1].lut);
  free(icc.trc[2].lut);
  return uVar2;
}

Assistant:

unsigned convertFromXYZFloat(float* out, const float* in, unsigned w, unsigned h,
                             const LodePNGState* state,
                             const float whitepoint[3], unsigned rendering_intent) {
  unsigned error = 0;
  const LodePNGInfo* info = &state->info_png;

  /* parse ICC if present */
  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  /* Handle gamut */
  error = convertFromXYZ_chrm(out, in, w, h, info, use_icc, &icc, whitepoint, rendering_intent);
  if(error) goto cleanup;

  /* Handle transfer function */
  convertFromXYZ_gamma(out, w, h, info, use_icc, &icc);

cleanup:
  lodepng_icc_cleanup(&icc);
  return error;
}